

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_metadata.cpp
# Opt level: O2

void __thiscall
duckdb::ParquetMetaDataOperatorData::~ParquetMetaDataOperatorData(ParquetMetaDataOperatorData *this)

{
  ~ParquetMetaDataOperatorData(this);
  operator_delete(this);
  return;
}

Assistant:

explicit ParquetMetaDataOperatorData(ClientContext &context, const vector<LogicalType> &types)
	    : collection(context, types) {
	}